

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

bool __thiscall QItemSelectionRange::isEmpty(QItemSelectionRange *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  QAbstractItemModel *pQVar6;
  bool bVar7;
  long in_FS_OFFSET;
  QModelIndex local_70;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isValid(this);
  bVar7 = true;
  if (bVar1) {
    pQVar6 = QPersistentModelIndex::model(&this->tl);
    if (pQVar6 != (QAbstractItemModel *)0x0) {
      uVar2 = QPersistentModelIndex::column(&this->tl);
      while( true ) {
        iVar3 = QPersistentModelIndex::column(&this->br);
        if (iVar3 < (int)uVar2) break;
        uVar4 = QPersistentModelIndex::row(&this->tl);
        while( true ) {
          iVar3 = QPersistentModelIndex::row(&this->br);
          if (iVar3 < (int)uVar4) break;
          local_48 = &DAT_aaaaaaaaaaaaaaaa;
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
          pQVar6 = QPersistentModelIndex::model(&this->tl);
          QPersistentModelIndex::parent(&local_70,&this->tl);
          (*(pQVar6->super_QObject)._vptr_QObject[0xc])
                    (&local_58,pQVar6,(ulong)uVar4,(ulong)uVar2,&local_70);
          pQVar6 = QPersistentModelIndex::model(&this->tl);
          uVar5 = (*(pQVar6->super_QObject)._vptr_QObject[0x27])(pQVar6,&local_58);
          uVar4 = uVar4 + 1;
          if ((~uVar5 & 0x21) == 0) {
            bVar7 = false;
            goto LAB_003ff8c9;
          }
        }
        uVar2 = uVar2 + 1;
      }
      bVar7 = true;
    }
  }
LAB_003ff8c9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QItemSelectionRange::isEmpty() const
{
    if (!isValid() || !model())
        return true;

    for (int column = left(); column <= right(); ++column) {
        for (int row = top(); row <= bottom(); ++row) {
            QModelIndex index = model()->index(row, column, parent());
            if (isSelectableAndEnabled(model()->flags(index)))
                return false;
        }
    }
    return true;
}